

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  uint uVar1;
  undefined1 auVar2 [12];
  CURLMcode CVar3;
  Curl_tree *pCVar4;
  Curl_easy *data;
  CURLMcode CVar5;
  curltime cVar6;
  curltime i;
  curltime now;
  Curl_tree *t;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar6 = Curl_now();
  CVar5 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) &&
     (CVar5 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    data = multi->easyp;
    auVar2 = cVar6._0_12_;
    if (data == (Curl_easy *)0x0) {
      CVar5 = CURLM_OK;
    }
    else {
      CVar5 = CURLM_OK;
      do {
        uVar1._0_1_ = (data->set).no_signal;
        uVar1._1_1_ = (data->set).global_dns_cache;
        uVar1._2_1_ = (data->set).tcp_nodelay;
        uVar1._3_1_ = (data->set).ignorecl;
        sigpipe_ignore((Curl_easy *)(ulong)uVar1,(sigpipe_ignore *)local_d0);
        cVar6._12_4_ = 0;
        cVar6.tv_sec = auVar2._0_8_;
        cVar6.tv_usec = auVar2._8_4_;
        CVar3 = multi_runsingle(multi,cVar6,data);
        if (local_38 == '\0') {
          sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
        }
        if (CVar3 != CURLM_OK) {
          CVar5 = CVar3;
        }
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    do {
      i._12_4_ = 0;
      i.tv_sec = auVar2._0_8_;
      i.tv_usec = auVar2._8_4_;
      pCVar4 = Curl_splaygetbest(i,multi->timetree,(Curl_tree **)&local_d0[0].sa_handler);
      multi->timetree = pCVar4;
      if (local_d0[0].sa_handler == (__sighandler_t)0x0) break;
      now._12_4_ = 0;
      now.tv_sec = auVar2._0_8_;
      now.tv_usec = auVar2._8_4_;
      add_next_timeout(now,multi,*(Curl_easy **)(local_d0[0].sa_handler + 0x30));
    } while (local_d0[0].sa_handler != (__sighandler_t)0x0);
    *running_handles = multi->num_alive;
    if (CVar5 < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
  }
  return CVar5;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    update_timer(multi);

  return returncode;
}